

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int in_EDI;
  QImage result;
  BarcodeFormat in_stack_0000003c;
  QString filename;
  QString text;
  BarcodeFormat format;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  QImage local_a0 [8];
  QString *in_stack_ffffffffffffff68;
  QStringView *in_stack_ffffffffffffff70;
  char local_88 [16];
  char *in_stack_ffffffffffffff88;
  QDebug *in_stack_ffffffffffffff90;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_38 [32];
  QDebug local_18 [20];
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ZXing::BarcodeFormatFromString(local_58,local_50);
    QString::QString((QString *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    QString::QString((QString *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ZXingQt::WriteBarcode((QStringView)filename.d._0_16_,in_stack_0000003c);
    QImage::save((QString *)local_a0,local_88,0);
    local_4 = 0;
    QImage::~QImage(local_a0);
    QString::~QString((QString *)0x103704);
    QString::~QString((QString *)0x10370e);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (int)((ulong)local_38 >> 0x20),in_stack_ffffffffffffff38);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QDebug::~QDebug(local_18);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc != 4) {
		qDebug() << "usage: ZXingQtWriter <format> <text> <filename>";
		return 1;
	}

	auto format = ZXing::BarcodeFormatFromString(argv[1]);
	auto text = QString(argv[2]);
	auto filename = QString(argv[3]);

	auto result = ZXingQt::WriteBarcode(text, format);

	result.save(filename);

	return 0;
}